

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcStatesPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,int *states1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int local_80;
  float local_7c;
  int j;
  float sumB;
  float sumA;
  float tmp;
  float *matrices2Ptr;
  int i;
  int state1;
  int w;
  int k;
  float *destPtr;
  float *partials2Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  float *matrices2_local;
  float *partials2_local;
  float *matrices1_local;
  int *states1_local;
  float *destP_local;
  
  iVar6 = this->kStateCount + 1;
  iVar1 = this->kStateCount;
  for (matrixOffset = 0; matrixOffset < this->kCategoryCount; matrixOffset = matrixOffset + 1) {
    iVar5 = matrixOffset * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar2 = this->kMatrixSize;
    destPtr = partials2 + iVar5;
    _w = destP + iVar5;
    for (state1 = startPattern; state1 < endPattern; state1 = state1 + 1) {
      i = matrixOffset * this->kMatrixSize;
      iVar5 = states1[state1];
      for (matrices2Ptr._0_4_ = 0; (int)matrices2Ptr < this->kStateCount;
          matrices2Ptr._0_4_ = (int)matrices2Ptr + 1) {
        lVar8 = (long)(matrixOffset * iVar2);
        lVar9 = (long)((int)matrices2Ptr * iVar6);
        iVar7 = i + iVar5;
        j = 0;
        local_7c = 0.0;
        for (local_80 = 0; local_80 < iVar1 / 4 << 2; local_80 = local_80 + 4) {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)destPtr[local_80]),
                                   ZEXT416((uint)matrices2[lVar8 + lVar9 + local_80]),
                                   ZEXT416((uint)j));
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)destPtr[local_80 + 1]),
                                   ZEXT416((uint)matrices2[lVar8 + lVar9 + (local_80 + 1)]),
                                   ZEXT416((uint)local_7c));
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)destPtr[local_80 + 2]),
                                   ZEXT416((uint)matrices2[lVar8 + lVar9 + (local_80 + 2)]),
                                   ZEXT416(auVar3._0_4_));
          j = auVar3._0_4_;
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)destPtr[local_80 + 3]),
                                   ZEXT416((uint)matrices2[lVar8 + lVar9 + (local_80 + 3)]),
                                   ZEXT416(auVar4._0_4_));
          local_7c = auVar3._0_4_;
        }
        for (; local_80 < this->kStateCount; local_80 = local_80 + 1) {
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)destPtr[local_80]),
                                   ZEXT416((uint)matrices2[lVar8 + lVar9 + local_80]),
                                   ZEXT416((uint)j));
          j = auVar3._0_4_;
        }
        i = iVar6 + i;
        *_w = matrices1[iVar7] * ((float)j + local_7c);
        _w = _w + 1;
      }
      destPtr = destPtr + this->kPartialsPaddedStateCount;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesPartials(REALTYPE* destP,
                                                           const int* states1,
                                                           const REALTYPE* matrices1,
                                                           const REALTYPE* partials2,
                                                           const REALTYPE* matrices2,
                                                           int startPattern,
                                                           int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;


    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state1 = states1[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE tmp = matrices1[w + state1];
                REALTYPE sumA = 0.0;
                REALTYPE sumB = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sumA += matrices2Ptr[j + 0] * partials2Ptr[j + 0];
                    sumB += matrices2Ptr[j + 1] * partials2Ptr[j + 1];
                    sumA += matrices2Ptr[j + 2] * partials2Ptr[j + 2];
                    sumB += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }
                for (; j < kStateCount; j++) {
                    sumA += matrices2Ptr[j] * partials2Ptr[j];
                }

                w += matrixIncr;

                *(destPtr++) = tmp * (sumA + sumB);
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPtr++) = 0.0;
                }
            }
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}